

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

void __thiscall Quat4f::normalize(Quat4f *this)

{
  int in_ESI;
  float extraout_XMM0_Da;
  float fVar1;
  float reciprocalAbs;
  Quat4f *this_local;
  
  abs(this,in_ESI);
  fVar1 = 1.0 / extraout_XMM0_Da;
  this->m_elements[0] = fVar1 * this->m_elements[0];
  this->m_elements[1] = fVar1 * this->m_elements[1];
  this->m_elements[2] = fVar1 * this->m_elements[2];
  this->m_elements[3] = fVar1 * this->m_elements[3];
  return;
}

Assistant:

void Quat4f::normalize()
{
	float reciprocalAbs = 1.f / abs();

	m_elements[ 0 ] *= reciprocalAbs;
	m_elements[ 1 ] *= reciprocalAbs;
	m_elements[ 2 ] *= reciprocalAbs;
	m_elements[ 3 ] *= reciprocalAbs;
}